

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

int __thiscall
f8n::runtime::MessageQueue::Remove(MessageQueue *this,IMessageTarget *target,int type)

{
  EnqueuedMessage *this_00;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  size_type sVar5;
  reference ppEVar6;
  rep rVar7;
  _List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*> local_a8;
  undefined4 local_9c;
  const_iterator local_98;
  _List_node_base *local_90;
  undefined1 local_78 [8];
  IMessagePtr current;
  _Self local_60;
  iterator it;
  undefined1 local_50 [4];
  int count;
  LockT lock;
  int type_local;
  IMessageTarget *target_local;
  MessageQueue *this_local;
  memory_order __b;
  
  lock._12_4_ = type;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_50,&this->queueMutex);
  it._M_node._4_4_ = 0;
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
       ::begin(&this->queue);
  do {
    current.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__cxx11::
           list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ::end(&this->queue);
    bVar2 = std::operator!=(&local_60,
                            (_Self *)&current.
                                      super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
    if (!bVar2) {
      sVar5 = std::__cxx11::
              list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
              ::size(&this->queue);
      if (sVar5 != 0) {
        local_a8._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
             ::begin(&this->queue);
        ppEVar6 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                            (&local_a8);
        rVar7 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&(*ppEVar6)->time);
        std::operator&(memory_order_seq_cst,__memory_order_mask);
        LOCK();
        (this->nextMessageTime).super___atomic_base<long>._M_i = rVar7;
        UNLOCK();
      }
      iVar3 = it._M_node._4_4_;
      local_9c = 1;
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
      return iVar3;
    }
    ppEVar6 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                        (&local_60);
    std::shared_ptr<f8n::runtime::IMessage>::shared_ptr
              ((shared_ptr<f8n::runtime::IMessage> *)local_78,&(*ppEVar6)->message);
    peVar4 = std::
             __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_78);
    iVar3 = (*peVar4->_vptr_IMessage[2])();
    uVar1 = lock._12_4_;
    if ((IMessageTarget *)CONCAT44(extraout_var,iVar3) == target) {
      if (lock._12_4_ != -1) {
        peVar4 = std::
                 __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_78);
        iVar3 = (*peVar4->_vptr_IMessage[3])();
        if (uVar1 != iVar3) goto LAB_002a527f;
      }
      ppEVar6 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                          (&local_60);
      this_00 = *ppEVar6;
      if (this_00 != (EnqueuedMessage *)0x0) {
        EnqueuedMessage::~EnqueuedMessage(this_00);
        operator_delete(this_00,0x18);
      }
      std::_List_const_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::_List_const_iterator
                (&local_98,&local_60);
      local_90 = (_List_node_base *)
                 std::__cxx11::
                 list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                 ::erase(&this->queue,local_98);
      it._M_node._4_4_ = it._M_node._4_4_ + 1;
      local_9c = 2;
      local_60._M_node = local_90;
    }
    else {
LAB_002a527f:
      std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator++(&local_60);
      local_9c = 0;
    }
    std::shared_ptr<f8n::runtime::IMessage>::~shared_ptr
              ((shared_ptr<f8n::runtime::IMessage> *)local_78);
  } while( true );
}

Assistant:

int MessageQueue::Remove(IMessageTarget *target, int type) {
    LockT lock(this->queueMutex);

    int count = 0;
    std::list<EnqueuedMessage*>::iterator it = this->queue.begin();
    while (it != this->queue.end()) {
        IMessagePtr current = (*it)->message;

        if (current->Target() == target) {
            if (type == -1 || type == current->Type()) {
                delete (*it);
                it = this->queue.erase(it);
                ++count;
                continue;
            }
        }

        ++it;
    }

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }

    return count;
}